

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O1

int SoapySDRDevice_writeGPIODir(SoapySDRDevice *device,char *bank,uint dir)

{
  undefined1 *puVar1;
  allocator local_49;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014ce80);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string((string *)local_48,bank,&local_49);
  (**(code **)(*(long *)device + 0x380))(device,local_48,dir);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return 0;
}

Assistant:

int SoapySDRDevice_writeGPIODir(SoapySDRDevice *device, const char *bank, const unsigned dir)
{
    __SOAPY_SDR_C_TRY
    device->writeGPIODir(bank, dir);
    __SOAPY_SDR_C_CATCH
}